

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Vec_Bit_t * Gia_ManFindComplLuts(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Bit_t *p;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  Vec_Bit_t *vMarks;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManObjNum(pGia);
  p = Vec_BitStart(iVar1);
  vMarks._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar3 = false;
    if (vMarks._4_4_ < iVar1) {
      pGStack_18 = Gia_ManCo(pGia,vMarks._4_4_);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_18);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninC0(pGStack_18);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0p(pGia,pGStack_18);
        Vec_BitWriteEntry(p,iVar1,1);
      }
    }
    vMarks._4_4_ = vMarks._4_4_ + 1;
  }
  vMarks._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar3 = false;
    if (vMarks._4_4_ < iVar1) {
      pGStack_18 = Gia_ManCo(pGia,vMarks._4_4_);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_18);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninC0(pGStack_18);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId0p(pGia,pGStack_18);
        Vec_BitWriteEntry(p,iVar1,0);
      }
    }
    vMarks._4_4_ = vMarks._4_4_ + 1;
  }
  return p;
}

Assistant:

Vec_Bit_t * Gia_ManFindComplLuts( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;  int i;
    // mark objects pointed by COs in negative polarity
    Vec_Bit_t * vMarks = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 1 );
    // unmark objects pointed by COs in positive polarity
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 0 );
    return vMarks;
}